

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlSetTreeDoc(xmlNodePtr tree,xmlDocPtr doc)

{
  xmlAttrPtr local_20;
  xmlAttrPtr prop;
  xmlDocPtr doc_local;
  xmlNodePtr tree_local;
  
  if (((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) && (tree->doc != doc)) {
    if (tree->type == XML_ELEMENT_NODE) {
      for (local_20 = tree->properties; local_20 != (xmlAttrPtr)0x0; local_20 = local_20->next) {
        if (local_20->atype == XML_ATTRIBUTE_ID) {
          xmlRemoveID(tree->doc,local_20);
        }
        local_20->doc = doc;
        xmlSetListDoc(local_20->children,doc);
      }
    }
    if (tree->children != (_xmlNode *)0x0) {
      xmlSetListDoc(tree->children,doc);
    }
    tree->doc = doc;
  }
  return;
}

Assistant:

void
xmlSetTreeDoc(xmlNodePtr tree, xmlDocPtr doc) {
    xmlAttrPtr prop;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL))
	return;
    if (tree->doc != doc) {
	if(tree->type == XML_ELEMENT_NODE) {
	    prop = tree->properties;
	    while (prop != NULL) {
                if (prop->atype == XML_ATTRIBUTE_ID) {
                    xmlRemoveID(tree->doc, prop);
                }

		prop->doc = doc;
		xmlSetListDoc(prop->children, doc);

                /*
                 * TODO: ID attributes should be also added to the new
                 * document, but this breaks things like xmlReplaceNode.
                 * The underlying problem is that xmlRemoveID is only called
                 * if a node is destroyed, not if it's unlinked.
                 */
#if 0
                if (xmlIsID(doc, tree, prop)) {
                    xmlChar *idVal = xmlNodeListGetString(doc, prop->children,
                                                          1);
                    xmlAddID(NULL, doc, idVal, prop);
                }
#endif

		prop = prop->next;
	    }
	}
	if (tree->children != NULL)
	    xmlSetListDoc(tree->children, doc);
	tree->doc = doc;
    }
}